

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O3

int lstrlenA(LPCSTR lpString)

{
  long lVar1;
  long lVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    lVar2 = 0;
    if ((lpString != (LPCSTR)0x0) && (*lpString != '\0')) {
      lVar2 = 0;
      do {
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (lpString[lVar1] != '\0');
    }
    return (int)lVar2;
  }
  abort();
}

Assistant:

int
PALAPI
lstrlenA( IN LPCSTR lpString)
{
    int nChar = 0;

    PERF_ENTRY(lstrlenA);
    ENTRY("lstrlenA (lpString=%p (%s))\n", lpString?lpString:"NULL", lpString?lpString:"NULL");
    if (lpString)
    {
        while (*lpString++)
        {
            nChar++;      
        }
    }
    LOGEXIT("lstrlenA returning int %d\n", nChar);
    PERF_EXIT(lstrlenA);
    return nChar;
}